

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftobjs.c
# Opt level: O3

void ft_glyphslot_grid_fit_metrics(FT_GlyphSlot slot,FT_Bool vertical)

{
  FT_Pos *pFVar1;
  ulong uVar2;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  undefined7 in_register_00000031;
  ulong uVar6;
  
  if ((int)CONCAT71(in_register_00000031,vertical) == 0) {
    pFVar1 = &(slot->metrics).vertBearingX;
    *(byte *)pFVar1 = (byte)*pFVar1 & 0xc0;
    pFVar1 = &(slot->metrics).vertBearingY;
    *(byte *)pFVar1 = (byte)*pFVar1 & 0xc0;
    uVar2 = (slot->metrics).horiBearingX;
    lVar3 = (slot->metrics).horiBearingY;
    uVar6 = lVar3 - (slot->metrics).height & 0xffffffffffffffc0;
    uVar4 = uVar2 & 0xffffffffffffffc0;
    (slot->metrics).horiBearingX = uVar4;
    uVar5 = lVar3 + 0x3fU & 0xffffffffffffffc0;
    (slot->metrics).horiBearingY = uVar5;
    (slot->metrics).width = ((slot->metrics).width + uVar2 + 0x3f & 0xffffffffffffffc0) - uVar4;
  }
  else {
    pFVar1 = &(slot->metrics).horiBearingX;
    *(byte *)pFVar1 = (byte)*pFVar1 & 0xc0;
    (slot->metrics).horiBearingY = (slot->metrics).horiBearingY + 0x3fU & 0xffffffffffffffc0;
    uVar2 = (slot->metrics).vertBearingX;
    uVar6 = (slot->metrics).vertBearingY;
    uVar5 = (slot->metrics).height + uVar6 + 0x3f & 0xffffffffffffffc0;
    uVar4 = uVar2 & 0xffffffffffffffc0;
    (slot->metrics).vertBearingX = uVar4;
    uVar6 = uVar6 & 0xffffffffffffffc0;
    (slot->metrics).vertBearingY = uVar6;
    (slot->metrics).width = ((slot->metrics).width + uVar2 + 0x3f & 0xffffffffffffffc0) - uVar4;
  }
  (slot->metrics).height = uVar5 - uVar6;
  (slot->metrics).horiAdvance = (slot->metrics).horiAdvance + 0x20U & 0xffffffffffffffc0;
  (slot->metrics).vertAdvance = (slot->metrics).vertAdvance + 0x20U & 0xffffffffffffffc0;
  return;
}

Assistant:

static void
  ft_glyphslot_grid_fit_metrics( FT_GlyphSlot  slot,
                                 FT_Bool       vertical )
  {
    FT_Glyph_Metrics*  metrics = &slot->metrics;
    FT_Pos             right, bottom;


    if ( vertical )
    {
      metrics->horiBearingX = FT_PIX_FLOOR( metrics->horiBearingX );
      metrics->horiBearingY = FT_PIX_CEIL_LONG( metrics->horiBearingY );

      right  = FT_PIX_CEIL_LONG( ADD_LONG( metrics->vertBearingX,
                                           metrics->width ) );
      bottom = FT_PIX_CEIL_LONG( ADD_LONG( metrics->vertBearingY,
                                           metrics->height ) );

      metrics->vertBearingX = FT_PIX_FLOOR( metrics->vertBearingX );
      metrics->vertBearingY = FT_PIX_FLOOR( metrics->vertBearingY );

      metrics->width  = SUB_LONG( right,
                                  metrics->vertBearingX );
      metrics->height = SUB_LONG( bottom,
                                  metrics->vertBearingY );
    }
    else
    {
      metrics->vertBearingX = FT_PIX_FLOOR( metrics->vertBearingX );
      metrics->vertBearingY = FT_PIX_FLOOR( metrics->vertBearingY );

      right  = FT_PIX_CEIL_LONG( ADD_LONG( metrics->horiBearingX,
                                           metrics->width ) );
      bottom = FT_PIX_FLOOR( SUB_LONG( metrics->horiBearingY,
                                       metrics->height ) );

      metrics->horiBearingX = FT_PIX_FLOOR( metrics->horiBearingX );
      metrics->horiBearingY = FT_PIX_CEIL_LONG( metrics->horiBearingY );

      metrics->width  = SUB_LONG( right,
                                  metrics->horiBearingX );
      metrics->height = SUB_LONG( metrics->horiBearingY,
                                  bottom );
    }

    metrics->horiAdvance = FT_PIX_ROUND_LONG( metrics->horiAdvance );
    metrics->vertAdvance = FT_PIX_ROUND_LONG( metrics->vertAdvance );
  }